

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O2

bool __thiscall ON_3dmConstructionPlane::Read(ON_3dmConstructionPlane *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int minor_version;
  int major_version;
  int local_18 [2];
  
  Default(this);
  local_18[0] = 0;
  local_18[1] = 0;
  bVar1 = ON_BinaryArchive::Read3dmChunkVersion(file,local_18 + 1,local_18);
  if ((bVar1) && (local_18[1] == 1)) {
    bVar1 = ON_BinaryArchive::ReadPlane(file,&this->m_plane);
    if (((bVar1) &&
        (((bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_grid_spacing), bVar1 &&
          (bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_snap_spacing), bVar1)) &&
         (bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_grid_line_count), bVar1)))) &&
       (bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_grid_thick_frequency), bVar1)) {
      bVar1 = ON_BinaryArchive::ReadString(file,&this->m_name);
      if (!bVar1) {
        return bVar1;
      }
      if (local_18[0] < 1) {
        return bVar1;
      }
      bVar1 = ON_BinaryArchive::ReadBool(file,&this->m_bDepthBuffer);
      return bVar1;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_3dmConstructionPlane::Read( ON_BinaryArchive& file )
{
  Default();
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if (rc && major_version==1) 
  {
    if (rc) rc = file.ReadPlane(m_plane);
    if (rc) rc = file.ReadDouble(&m_grid_spacing);
    if (rc) rc = file.ReadDouble(&m_snap_spacing);
    if (rc) rc = file.ReadInt(&m_grid_line_count);
    if (rc) rc = file.ReadInt(&m_grid_thick_frequency);
    if (rc) rc = file.ReadString(m_name);

    if ( minor_version >= 1 )
    {
      if (rc) rc = file.ReadBool(&m_bDepthBuffer);
    }
  }
  return rc;
}